

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_image_draw_rectangle(rf_image *dst,rf_rec rec,rf_color color,rf_allocator temp_allocator)

{
  undefined1 auVar1 [16];
  rf_image src_00;
  rf_source_location rVar2;
  rf_allocator_args rVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  rf_rec dst_rec;
  rf_image src;
  uint uStack_8c;
  rf_image local_70;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  rf_allocator local_30;
  
  if (dst->valid == true) {
    local_58._8_4_ = in_XMM0_Dc;
    local_58._0_8_ = rec._0_8_;
    local_58._12_4_ = in_XMM0_Dd;
    dst->valid = false;
    local_48._8_4_ = in_XMM1_Dc;
    local_48._0_8_ = rec._8_8_;
    local_48._12_4_ = in_XMM1_Dd;
    rf_gen_image_color(&local_70,(int)rec.width,(int)rec.height,color,temp_allocator);
    auVar5 = local_48;
    auVar4 = local_58;
    if (local_70.valid == true) {
      src_00.valid = local_70.valid;
      src_00._21_3_ = local_70._21_3_;
      src_00.format = local_70.format;
      src_00.width = local_70.width;
      src_00.height = local_70.height;
      src_00.data = local_70.data;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_48._0_8_;
      dst_rec.width = (float)local_48._0_4_;
      dst_rec.height = (float)local_48._4_4_;
      dst_rec.x = (float)local_58._0_4_;
      dst_rec.y = (float)local_58._4_4_;
      local_58 = auVar4;
      local_48 = auVar5;
      rf_image_draw(dst,src_00,(rf_rec)(auVar1 << 0x40),dst_rec,(rf_color)0xffffffff,temp_allocator)
      ;
      rVar2.proc_name = "rf_unload_image";
      rVar2.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar2.line_in_file = 0x3d3b;
      rVar3.size_to_allocate_or_reallocate = 0;
      rVar3.pointer_to_free_or_realloc = local_70.data;
      rVar3._16_8_ = (ulong)uStack_8c << 0x20;
      local_30.user_data = temp_allocator.user_data;
      local_30.allocator_proc = temp_allocator.allocator_proc;
      (*temp_allocator.allocator_proc)(&local_30,rVar2,RF_AM_FREE,rVar3);
    }
  }
  return;
}

Assistant:

RF_API void rf_image_draw_rectangle(rf_image* dst, rf_rec rec, rf_color color, rf_allocator temp_allocator)
{
    if (dst->valid)
    {
        dst->valid = false;

        rf_image src = rf_gen_image_color((int)rec.width, (int)rec.height, color, temp_allocator);

        if (src.valid)
        {
            rf_rec src_rec = (rf_rec){ 0, 0, rec.width, rec.height };

            rf_image_draw(dst, src, src_rec, rec, RF_WHITE, temp_allocator);

            rf_unload_image(src, temp_allocator);
        }
    }
}